

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Remove_Doctor
          (Hospital *this,vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,string *id)

{
  pointer pDVar1;
  long lVar2;
  __type _Var3;
  ulong uVar4;
  long lVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  uVar4 = 0xffffffffffffffff;
  lVar2 = -0x178;
  do {
    lVar5 = lVar2;
    pDVar1 = (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = uVar4 + 1;
    if ((ulong)(((long)(All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl
                       .super__Vector_impl_data._M_finish - (long)pDVar1) / 0x178) <= uVar4) {
      return;
    }
    Doctor::doctor_all_ino_getter_abi_cxx11_
              (&local_48,(Doctor *)((long)&pDVar1[1].super_Human.Id._M_dataplus + lVar5));
    _Var3 = std::operator==(local_48.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,id);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    lVar2 = lVar5 + 0x178;
  } while (!_Var3);
  std::vector<Doctor,_std::allocator<Doctor>_>::erase
            (All_Of_Doctors,
             (Doctor *)
             ((long)&(All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
                     super__Vector_impl_data._M_start[1].super_Human.Id._M_dataplus + lVar5));
  return;
}

Assistant:

void Hospital :: Remove_Doctor(vector<Doctor> &All_Of_Doctors, string id){

    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if(All_Of_Doctors[i].doctor_all_ino_getter()[0] == id){
            All_Of_Doctors.erase(All_Of_Doctors.begin()+i);
            ///remove from files
            break;
        }
    }
}